

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# substitute.h
# Opt level: O0

void absl::SubstituteAndAppend
               (Nonnull<std::string_*> output,string_view format,Arg *a0,Arg *a1,Arg *a2,Arg *a3,
               Arg *a4)

{
  Arg *in_RCX;
  Arg *in_R8;
  Arg *in_R9;
  Arg *in_stack_00000008;
  string_view args [5];
  size_t in_stack_00000160;
  Nullable<const_absl::string_view_*> in_stack_00000168;
  Nonnull<std::string_*> in_stack_00000170;
  undefined1 in_stack_00000178 [16];
  
  substitute_internal::Arg::piece(in_RCX);
  substitute_internal::Arg::piece(in_R8);
  substitute_internal::Arg::piece(in_R9);
  substitute_internal::Arg::piece(in_stack_00000008);
  substitute_internal::Arg::piece((Arg *)args[0]._M_len);
  substitute_internal::SubstituteAndAppendArray
            (in_stack_00000170,(string_view)in_stack_00000178,in_stack_00000168,in_stack_00000160);
  return;
}

Assistant:

inline void SubstituteAndAppend(absl::Nonnull<std::string*> output,
                                absl::string_view format,
                                const substitute_internal::Arg& a0,
                                const substitute_internal::Arg& a1,
                                const substitute_internal::Arg& a2,
                                const substitute_internal::Arg& a3,
                                const substitute_internal::Arg& a4) {
  const absl::string_view args[] = {a0.piece(), a1.piece(), a2.piece(),
                                    a3.piece(), a4.piece()};
  substitute_internal::SubstituteAndAppendArray(output, format, args,
                                                ABSL_ARRAYSIZE(args));
}